

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void convertToWithoutRowidTable(Parse *pParse,Table *pTab)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  short sVar5;
  sqlite3 *db;
  Vdbe *pVVar6;
  Column *pCVar7;
  bool bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  Op *pOVar13;
  size_t sVar14;
  Expr *pExpr;
  ExprList *pList;
  long lVar15;
  RenameToken *pRVar16;
  uint uVar17;
  int iVar18;
  short *psVar19;
  Index *pIdx;
  ulong uVar20;
  uint uVar21;
  Index *pIdx_00;
  long in_FS_OFFSET;
  char cVar22;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  pVVar6 = pParse->pVdbe;
  if (((db->init).field_0x6 & 2) == 0) {
    if (0 < pTab->nCol) {
      lVar12 = 8;
      lVar15 = 0;
      do {
        pCVar7 = pTab->aCol;
        if (((*(byte *)((long)&pCVar7->zCnName + lVar12 + 6) & 1) != 0) &&
           (bVar2 = *(byte *)((long)&pCVar7->zCnName + lVar12), (bVar2 & 0xf) == 0)) {
          *(byte *)((long)&pCVar7->zCnName + lVar12) = bVar2 | 2;
        }
        lVar15 = lVar15 + 1;
        lVar12 = lVar12 + 0x10;
      } while (lVar15 < pTab->nCol);
    }
    pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  if ((long)(pParse->u1).addrCrTab != 0) {
    if (pVVar6->db->mallocFailed == '\0') {
      pOVar13 = pVVar6->aOp + (pParse->u1).addrCrTab;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->p3 = 2;
  }
  if ((long)pTab->iPKey < 0) {
    for (pIdx_00 = pTab->pIndex;
        (pIdx_00 != (Index *)0x0 && ((*(ushort *)&pIdx_00->field_0x63 & 3) != 2));
        pIdx_00 = pIdx_00->pNext) {
    }
    iVar18 = 1;
    if (1 < pIdx_00->nKeyCol) {
      iVar18 = 1;
      uVar20 = 1;
      do {
        iVar10 = isDupColumn(pIdx_00,iVar18,pIdx_00,(int)uVar20);
        if (iVar10 == 0) {
          pIdx_00->azColl[iVar18] = pIdx_00->azColl[uVar20];
          pIdx_00->aSortOrder[iVar18] = pIdx_00->aSortOrder[uVar20];
          pIdx_00->aiColumn[iVar18] = pIdx_00->aiColumn[uVar20];
          iVar18 = iVar18 + 1;
        }
        else {
          pIdx_00->nColumn = pIdx_00->nColumn - 1;
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 < pIdx_00->nKeyCol);
    }
    pIdx_00->nKeyCol = (u16)iVar18;
  }
  else {
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = pTab->aCol[pTab->iPKey].zCnName;
    if ((char *)local_48._0_8_ == (char *)0x0) {
      uVar9 = 0;
    }
    else {
      sVar14 = strlen((char *)local_48._0_8_);
      uVar9 = (uint)sVar14 & 0x3fffffff;
    }
    local_48._8_4_ = uVar9;
    pExpr = sqlite3ExprAlloc(db,0x3c,(Token *)local_48,0);
    pList = sqlite3ExprListAppendNew(pParse->db,pExpr);
    if (pList == (ExprList *)0x0) {
LAB_001805ae:
      *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags & 0x7f;
      pIdx_00 = (Index *)&DAT_aaaaaaaaaaaaaaaa;
      bVar8 = false;
    }
    else {
      if ((1 < pParse->eParseMode) && (pRVar16 = pParse->pRename, pRVar16 != (RenameToken *)0x0)) {
        do {
          if ((i16 *)pRVar16->p == &pTab->iPKey) {
            pRVar16->p = pList->a[0].pExpr;
            break;
          }
          pRVar16 = pRVar16->pNext;
        } while (pRVar16 != (RenameToken *)0x0);
      }
      pList->a[0].fg.sortFlags = pParse->iPkSortOrder;
      pTab->iPKey = -1;
      sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,(uint)pTab->keyConf,
                         (Token *)0x0,(Expr *)0x0,0,0,'\x02');
      if (pParse->nErr != 0) goto LAB_001805ae;
      bVar8 = true;
      for (pIdx_00 = pTab->pIndex;
          (pIdx_00 != (Index *)0x0 && ((*(ushort *)&pIdx_00->field_0x63 & 3) != 2));
          pIdx_00 = pIdx_00->pNext) {
      }
    }
    if (!bVar8) goto LAB_00180864;
  }
  uVar3 = *(ushort *)&pIdx_00->field_0x63;
  *(ushort *)&pIdx_00->field_0x63 = uVar3 | 0x20;
  if (((db->init).field_0x6 & 2) == 0) {
    *(ushort *)&pIdx_00->field_0x63 = uVar3 | 0x28;
  }
  uVar3 = pIdx_00->nKeyCol;
  uVar9 = (uint)uVar3;
  pIdx_00->nColumn = uVar3;
  if ((pVVar6 != (Vdbe *)0x0) && ((long)(int)pIdx_00->tnum != 0)) {
    if (pVVar6->db->mallocFailed == '\0') {
      pOVar13 = pVVar6->aOp + (int)pIdx_00->tnum;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->opcode = '\t';
  }
  pIdx_00->tnum = pTab->tnum;
  pIdx = pTab->pIndex;
  if (pIdx != (Index *)0x0) {
    uVar17 = (uint)uVar3;
    do {
      cVar22 = '\n';
      if ((*(ushort *)&pIdx->field_0x63 & 3) != 2) {
        if (uVar17 == 0) {
          iVar18 = 0;
        }
        else {
          uVar4 = pIdx->nKeyCol;
          iVar18 = 0;
          uVar21 = 0;
          do {
            uVar11 = isDupColumn(pIdx,(uint)uVar4,pIdx_00,uVar21);
            iVar18 = iVar18 + (uVar11 ^ 1);
            uVar21 = uVar21 + 1;
          } while (uVar17 != uVar21);
        }
        if (iVar18 == 0) {
          pIdx->nColumn = pIdx->nKeyCol;
          cVar22 = '\n';
        }
        else {
          iVar18 = resizeIndexObject(db,pIdx,iVar18 + (uint)pIdx->nKeyCol);
          cVar22 = iVar18 != 0;
          if ((!(bool)cVar22) && (uVar3 != 0)) {
            uVar21 = (uint)pIdx->nKeyCol;
            uVar20 = 0;
            do {
              iVar18 = isDupColumn(pIdx,(uint)pIdx->nKeyCol,pIdx_00,(int)uVar20);
              if (iVar18 == 0) {
                pIdx->aiColumn[(int)uVar21] = pIdx_00->aiColumn[uVar20];
                pIdx->azColl[(int)uVar21] = pIdx_00->azColl[uVar20];
                if (pIdx_00->aSortOrder[uVar20] != '\0') {
                  pIdx->field_0x64 = pIdx->field_0x64 | 4;
                }
                uVar21 = uVar21 + 1;
              }
              uVar20 = uVar20 + 1;
            } while (uVar17 != uVar20);
            cVar22 = '\0';
          }
        }
      }
      if ((cVar22 != '\n') && (cVar22 != '\0')) goto LAB_00180864;
      pIdx = pIdx->pNext;
    } while (pIdx != (Index *)0x0);
  }
  uVar17 = (uint)uVar3;
  if ((long)pTab->nCol < 1) {
    iVar18 = 0;
  }
  else {
    uVar20 = 0;
    iVar18 = 0;
    psVar19 = pIdx_00->aiColumn;
    uVar21 = uVar17;
LAB_00180791:
    do {
      uVar11 = uVar21;
      if ((int)uVar11 < 1) {
LAB_001807b2:
        iVar18 = iVar18 + (uint)((pTab->aCol[uVar20].colFlags & 0x20) == 0);
      }
      else {
        sVar5 = *psVar19;
        psVar19 = psVar19 + 1;
        uVar21 = uVar11 - 1;
        if (uVar20 != (uint)(int)sVar5) goto LAB_00180791;
        if ((int)uVar11 < 1) goto LAB_001807b2;
      }
      uVar20 = uVar20 + 1;
      psVar19 = pIdx_00->aiColumn;
      uVar21 = uVar17;
    } while (uVar20 != (long)pTab->nCol);
  }
  iVar18 = resizeIndexObject(db,pIdx_00,iVar18 + uVar17);
  if (iVar18 == 0) {
    if (0 < pTab->nCol) {
      uVar20 = 0;
      do {
        psVar19 = pIdx_00->aiColumn;
        uVar17 = uVar9;
        do {
          uVar21 = uVar17;
          if ((int)uVar21 < 1) goto LAB_0018082c;
          sVar5 = *psVar19;
          psVar19 = psVar19 + 1;
          uVar17 = uVar21 - 1;
        } while (uVar20 != (uint)(int)sVar5);
        if ((int)uVar21 < 1) {
LAB_0018082c:
          if ((pTab->aCol[uVar20].colFlags & 0x20) == 0) {
            pIdx_00->aiColumn[(int)uVar9] = (short)uVar20;
            pIdx_00->azColl[(int)uVar9] = "BINARY";
            uVar9 = uVar9 + 1;
          }
        }
        uVar20 = uVar20 + 1;
      } while ((long)uVar20 < (long)pTab->nCol);
    }
    recomputeColumnsNotIndexed(pIdx_00);
  }
LAB_00180864:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void convertToWithoutRowidTable(Parse *pParse, Table *pTab){
  Index *pIdx;
  Index *pPk;
  int nPk;
  int nExtra;
  int i, j;
  sqlite3 *db = pParse->db;
  Vdbe *v = pParse->pVdbe;

  /* Mark every PRIMARY KEY column as NOT NULL (except for imposter tables)
  */
  if( !db->init.imposterTable ){
    for(i=0; i<pTab->nCol; i++){
      if( (pTab->aCol[i].colFlags & COLFLAG_PRIMKEY)!=0
       && (pTab->aCol[i].notNull==OE_None)
      ){
        pTab->aCol[i].notNull = OE_Abort;
      }
    }
    pTab->tabFlags |= TF_HasNotNull;
  }

  /* Convert the P3 operand of the OP_CreateBtree opcode from BTREE_INTKEY
  ** into BTREE_BLOBKEY.
  */
  assert( !pParse->bReturning );
  if( pParse->u1.addrCrTab ){
    assert( v );
    sqlite3VdbeChangeP3(v, pParse->u1.addrCrTab, BTREE_BLOBKEY);
  }

  /* Locate the PRIMARY KEY index.  Or, if this table was originally
  ** an INTEGER PRIMARY KEY table, create a new PRIMARY KEY index.
  */
  if( pTab->iPKey>=0 ){
    ExprList *pList;
    Token ipkToken;
    sqlite3TokenInit(&ipkToken, pTab->aCol[pTab->iPKey].zCnName);
    pList = sqlite3ExprListAppend(pParse, 0,
                  sqlite3ExprAlloc(db, TK_ID, &ipkToken, 0));
    if( pList==0 ){
      pTab->tabFlags &= ~TF_WithoutRowid;
      return;
    }
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenRemap(pParse, pList->a[0].pExpr, &pTab->iPKey);
    }
    pList->a[0].fg.sortFlags = pParse->iPkSortOrder;
    assert( pParse->pNewTable==pTab );
    pTab->iPKey = -1;
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, pTab->keyConf, 0, 0, 0, 0,
                       SQLITE_IDXTYPE_PRIMARYKEY);
    if( pParse->nErr ){
      pTab->tabFlags &= ~TF_WithoutRowid;
      return;
    }
    assert( db->mallocFailed==0 );
    pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk->nKeyCol==1 );
  }else{
    pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk!=0 );

    /*
    ** Remove all redundant columns from the PRIMARY KEY.  For example, change
    ** "PRIMARY KEY(a,b,a,b,c,b,c,d)" into just "PRIMARY KEY(a,b,c,d)".  Later
    ** code assumes the PRIMARY KEY contains no repeated columns.
    */
    for(i=j=1; i<pPk->nKeyCol; i++){
      if( isDupColumn(pPk, j, pPk, i) ){
        pPk->nColumn--;
      }else{
        testcase( hasColumn(pPk->aiColumn, j, pPk->aiColumn[i]) );
        pPk->azColl[j] = pPk->azColl[i];
        pPk->aSortOrder[j] = pPk->aSortOrder[i];
        pPk->aiColumn[j++] = pPk->aiColumn[i];
      }
    }
    pPk->nKeyCol = j;
  }
  assert( pPk!=0 );
  pPk->isCovering = 1;
  if( !db->init.imposterTable ) pPk->uniqNotNull = 1;
  nPk = pPk->nColumn = pPk->nKeyCol;

  /* Bypass the creation of the PRIMARY KEY btree and the sqlite_schema
  ** table entry. This is only required if currently generating VDBE
  ** code for a CREATE TABLE (not when parsing one as part of reading
  ** a database schema).  */
  if( v && pPk->tnum>0 ){
    assert( db->init.busy==0 );
    sqlite3VdbeChangeOpcode(v, (int)pPk->tnum, OP_Goto);
  }

  /* The root page of the PRIMARY KEY is the table root page */
  pPk->tnum = pTab->tnum;

  /* Update the in-memory representation of all UNIQUE indices by converting
  ** the final rowid column into one or more columns of the PRIMARY KEY.
  */
  for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    int n;
    if( IsPrimaryKeyIndex(pIdx) ) continue;
    for(i=n=0; i<nPk; i++){
      if( !isDupColumn(pIdx, pIdx->nKeyCol, pPk, i) ){
        testcase( hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) );
        n++;
      }
    }
    if( n==0 ){
      /* This index is a superset of the primary key */
      pIdx->nColumn = pIdx->nKeyCol;
      continue;
    }
    if( resizeIndexObject(db, pIdx, pIdx->nKeyCol+n) ) return;
    for(i=0, j=pIdx->nKeyCol; i<nPk; i++){
      if( !isDupColumn(pIdx, pIdx->nKeyCol, pPk, i) ){
        testcase( hasColumn(pIdx->aiColumn, pIdx->nKeyCol, pPk->aiColumn[i]) );
        pIdx->aiColumn[j] = pPk->aiColumn[i];
        pIdx->azColl[j] = pPk->azColl[i];
        if( pPk->aSortOrder[i] ){
          /* See ticket https://www.sqlite.org/src/info/bba7b69f9849b5bf */
          pIdx->bAscKeyBug = 1;
        }
        j++;
      }
    }
    assert( pIdx->nColumn>=pIdx->nKeyCol+n );
    assert( pIdx->nColumn>=j );
  }

  /* Add all table columns to the PRIMARY KEY index
  */
  nExtra = 0;
  for(i=0; i<pTab->nCol; i++){
    if( !hasColumn(pPk->aiColumn, nPk, i)
     && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0 ) nExtra++;
  }
  if( resizeIndexObject(db, pPk, nPk+nExtra) ) return;
  for(i=0, j=nPk; i<pTab->nCol; i++){
    if( !hasColumn(pPk->aiColumn, j, i)
     && (pTab->aCol[i].colFlags & COLFLAG_VIRTUAL)==0
    ){
      assert( j<pPk->nColumn );
      pPk->aiColumn[j] = i;
      pPk->azColl[j] = sqlite3StrBINARY;
      j++;
    }
  }
  assert( pPk->nColumn==j );
  assert( pTab->nNVCol<=j );
  recomputeColumnsNotIndexed(pPk);
}